

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int fast_mp_montgomery_reduce(mp_int *x,mp_int *n,mp_digit rho)

{
  uint uVar1;
  uint uVar2;
  mp_digit *pmVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  mp_int *b;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong *puVar13;
  ulong uVar14;
  mp_digit *pmVar15;
  ulong uVar16;
  ulong *puVar17;
  mp_word *_W;
  uint uVar18;
  mp_word W [512];
  ulong local_2048;
  mp_int *local_2040;
  mp_digit local_2038;
  ulong local_2030 [1024];
  
  uVar1 = x->used;
  uVar7 = uVar1;
  if (x->alloc <= n->used) {
    iVar6 = mp_grow(x,n->used + 1);
    if (iVar6 != 0) {
      return iVar6;
    }
    uVar7 = x->used;
  }
  pmVar3 = x->dp;
  if ((int)uVar7 < 1) {
    pmVar15 = &local_2038;
    uVar12 = 0;
  }
  else {
    pmVar15 = &local_2038;
    lVar10 = 0;
    do {
      *pmVar15 = pmVar3[lVar10];
      pmVar15[1] = 0;
      pmVar15 = pmVar15 + 2;
      lVar10 = lVar10 + 1;
      uVar12 = uVar7;
    } while (uVar7 != (uint)lVar10);
  }
  uVar2 = n->used;
  uVar14 = (ulong)uVar2;
  uVar18 = uVar2 * 2;
  local_2040 = n;
  if ((int)uVar12 <= (int)uVar18) {
    if ((int)uVar7 <= (int)uVar18) {
      uVar7 = uVar18;
    }
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    memset(pmVar15,0,(ulong)(uVar7 - uVar12) * 0x10 + 0x10);
  }
  b = local_2040;
  if ((int)uVar2 < 1) {
    uVar7 = 0;
  }
  else {
    pmVar15 = local_2040->dp;
    uVar16 = 0;
    do {
      puVar17 = &local_2038 + uVar16 * 2;
      uVar11 = *puVar17;
      lVar10 = 0;
      puVar13 = puVar17;
      do {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar11 * rho & 0xfffffffffffffff;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = pmVar15[lVar10];
        uVar8 = SUB168(auVar4 * auVar5,0);
        uVar9 = *puVar13;
        *puVar13 = *puVar13 + uVar8;
        puVar13[1] = puVar13[1] + SUB168(auVar4 * auVar5,8) + (ulong)CARRY8(uVar9,uVar8);
        puVar13 = puVar13 + 2;
        lVar10 = lVar10 + 1;
      } while (uVar2 != (uint)lVar10);
      uVar9 = local_2030[uVar16 * 2];
      uVar8 = *puVar17 >> 0x3c | uVar9 << 4;
      uVar16 = uVar16 + 1;
      puVar13 = &local_2038 + uVar16 * 2;
      uVar11 = *puVar13;
      *puVar13 = *puVar13 + uVar8;
      local_2030[uVar16 * 2] =
           local_2030[uVar16 * 2] + (uVar9 >> 0x3c) + (ulong)CARRY8(uVar11,uVar8);
      uVar7 = uVar2;
    } while (uVar16 != uVar14);
  }
  if (uVar7 == uVar18 || SBORROW4(uVar7,uVar18) != (int)(uVar7 + uVar2 * -2) < 0) {
    uVar11 = (ulong)uVar7;
    puVar13 = local_2030 + uVar11 * 2 + 1;
    uVar16 = (&local_2038)[uVar11 * 2];
    uVar11 = local_2030[uVar11 * 2];
    iVar6 = ~uVar18 + uVar7;
    do {
      uVar9 = uVar16 >> 0x3c | uVar11 << 4;
      uVar16 = uVar9 + *puVar13;
      uVar11 = (uVar11 >> 0x3c) + puVar13[1] + (ulong)CARRY8(uVar9,*puVar13);
      *puVar13 = uVar16;
      puVar13[1] = uVar11;
      puVar13 = puVar13 + 2;
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0);
  }
  pmVar15 = pmVar3;
  if ((int)uVar2 < 0) {
    uVar7 = 0;
  }
  else {
    puVar13 = &local_2048 + uVar14 * 2;
    uVar7 = uVar2 + 1;
    uVar12 = uVar7;
    do {
      puVar13 = puVar13 + 2;
      *pmVar15 = *puVar13 & 0xfffffffffffffff;
      pmVar15 = pmVar15 + 1;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  if ((int)uVar7 < (int)uVar1) {
    memset(pmVar15,0,(ulong)(uVar1 + ~uVar7) * 8 + 8);
  }
  x->used = uVar2 + 1;
  if ((int)uVar2 < 0) {
    if (uVar2 + 1 != 0) goto LAB_00106ef0;
  }
  else {
    do {
      iVar6 = (int)uVar14;
      if (pmVar3[(ulong)(iVar6 + 1U) - 1] != 0) goto LAB_00106ef0;
      x->used = iVar6;
      uVar14 = (ulong)(iVar6 - 1);
    } while (1 < (int)(iVar6 + 1U));
  }
  x->sign = 0;
LAB_00106ef0:
  iVar6 = mp_cmp_mag(x,b);
  if (iVar6 == -1) {
    return 0;
  }
  iVar6 = s_mp_sub(x,b,x);
  return iVar6;
}

Assistant:

int fast_mp_montgomery_reduce (mp_int * x, mp_int * n, mp_digit rho)
{
  int     ix, res, olduse;
  mp_word W[MP_WARRAY];

  /* get old used count */
  olduse = x->used;

  /* grow a as required */
  if (x->alloc < n->used + 1) {
    if ((res = mp_grow (x, n->used + 1)) != MP_OKAY) {
      return res;
    }
  }

  /* first we have to get the digits of the input into
   * an array of double precision words W[...]
   */
  {
    register mp_word *_W;
    register mp_digit *tmpx;

    /* alias for the W[] array */
    _W   = W;

    /* alias for the digits of  x*/
    tmpx = x->dp;

    /* copy the digits of a into W[0..a->used-1] */
    for (ix = 0; ix < x->used; ix++) {
      *_W++ = *tmpx++;
    }

    /* zero the high words of W[a->used..m->used*2] */
    for (; ix < n->used * 2 + 1; ix++) {
      *_W++ = 0;
    }
  }

  /* now we proceed to zero successive digits
   * from the least significant upwards
   */
  for (ix = 0; ix < n->used; ix++) {
    /* mu = ai * m' mod b
     *
     * We avoid a double precision multiplication (which isn't required)
     * by casting the value down to a mp_digit.  Note this requires
     * that W[ix-1] have  the carry cleared (see after the inner loop)
     */
    register mp_digit mu;
    mu = (mp_digit) (((W[ix] & MP_MASK) * rho) & MP_MASK);

    /* a = a + mu * m * b**i
     *
     * This is computed in place and on the fly.  The multiplication
     * by b**i is handled by offseting which columns the results
     * are added to.
     *
     * Note the comba method normally doesn't handle carries in the
     * inner loop In this case we fix the carry from the previous
     * column since the Montgomery reduction requires digits of the
     * result (so far) [see above] to work.  This is
     * handled by fixing up one carry after the inner loop.  The
     * carry fixups are done in order so after these loops the
     * first m->used words of W[] have the carries fixed
     */
    {
      register int iy;
      register mp_digit *tmpn;
      register mp_word *_W;

      /* alias for the digits of the modulus */
      tmpn = n->dp;

      /* Alias for the columns set by an offset of ix */
      _W = W + ix;

      /* inner loop */
      for (iy = 0; iy < n->used; iy++) {
          *_W++ += ((mp_word)mu) * ((mp_word)*tmpn++);
      }
    }

    /* now fix carry for next digit, W[ix+1] */
    W[ix + 1] += W[ix] >> ((mp_word) DIGIT_BIT);
  }

  /* now we have to propagate the carries and
   * shift the words downward [all those least
   * significant digits we zeroed].
   */
  {
    register mp_digit *tmpx;
    register mp_word *_W, *_W1;

    /* nox fix rest of carries */

    /* alias for current word */
    _W1 = W + ix;

    /* alias for next word, where the carry goes */
    _W = W + ++ix;

    for (; ix <= n->used * 2 + 1; ix++) {
      *_W++ += *_W1++ >> ((mp_word) DIGIT_BIT);
    }

    /* copy out, A = A/b**n
     *
     * The result is A/b**n but instead of converting from an
     * array of mp_word to mp_digit than calling mp_rshd
     * we just copy them in the right order
     */

    /* alias for destination word */
    tmpx = x->dp;

    /* alias for shifted double precision result */
    _W = W + n->used;

    for (ix = 0; ix < n->used + 1; ix++) {
      *tmpx++ = (mp_digit)(*_W++ & ((mp_word) MP_MASK));
    }

    /* zero oldused digits, if the input a was larger than
     * m->used+1 we'll have to clear the digits
     */
    for (; ix < olduse; ix++) {
      *tmpx++ = 0;
    }
  }

  /* set the max used and clamp */
  x->used = n->used + 1;
  mp_clamp (x);

  /* if A >= m then A = A - m */
  if (mp_cmp_mag (x, n) != MP_LT) {
    return s_mp_sub (x, n, x);
  }
  return MP_OKAY;
}